

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateArenaString
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  bool bVar1;
  Options *pOVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  Options *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar5;
  Options *field_00;
  Options *extraout_RDX;
  FieldDescriptor *field_01;
  string *this_00;
  LogMessage local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string default_string;
  string local_60;
  string local_40;
  
  bVar1 = HasHasbit(field);
  pOVar2 = field_00;
  if (bVar1) {
    FieldName_abi_cxx11_((string *)&local_d8,(cpp *)field,(FieldDescriptor *)field_00);
    Formatter::operator()
              (format,"_Internal::set_has_$1$(&$has_bits$);\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    pOVar2 = extraout_RDX;
  }
  if (*(long *)(*(long *)(field + 0x40) + 8) == 0) {
    ProtobufNamespace_abi_cxx11_(&local_a0,(cpp *)this->options_,pOVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   "::",&local_a0);
    std::operator+(&default_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   "::internal::GetEmptyStringAlreadyInited()");
    std::__cxx11::string::~string((string *)&local_d8);
    this_00 = &local_a0;
  }
  else {
    QualifiedClassName_abi_cxx11_
              (&local_40,*(cpp **)(field + 0x20),(Descriptor *)this->options_,in_RCX);
    std::operator+(&local_a0,&local_40,"::");
    MakeDefaultName_abi_cxx11_(&local_60,(cpp *)field,field_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   &local_a0,&local_60);
    std::operator+(&default_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   ".get()");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    this_00 = &local_40;
  }
  std::__cxx11::string::~string((string *)this_00);
  Formatter::operator()<>
            (format,
             "if (arena != nullptr) {\n  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  pOVar2 = this->options_;
  bVar1 = IsStringInlined(field,pOVar2);
  if (bVar1) {
    iVar5 = extraout_EDX;
    if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27d);
      pOVar2 = (Options *)
               internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: !inlined_string_indices_.empty(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,(LogMessage *)pOVar2);
      internal::LogMessage::~LogMessage(&local_d8);
      iVar5 = extraout_EDX_00;
    }
    pcVar3 = FieldDescriptor::index(field,(char *)pOVar2,iVar5);
    iVar5 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)pcVar3];
    if (iVar5 < 0) {
      internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27f);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: (inlined_string_index) >= (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      internal::LogMessage::~LogMessage(&local_d8);
    }
    local_a0._M_dataplus._M_p._0_4_ = iVar5 / 0x20;
    local_d8._0_8_ = 1L << ((byte)iVar5 & 0x1f);
    local_d8.filename_._0_4_ = 8;
    Formatter::operator()
              (format,
               ", $msg$_internal_$name$_donated(), &$msg$_inlined_string_donated_[$1$], ~0x$2$u",
               (int *)&local_a0,(Hex *)&local_d8);
  }
  else if (*(long *)(*(long *)(field + 0x40) + 8) != 0) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x287);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: field->default_value_string().empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  Formatter::operator()
            (format,
             ");\n} else {\n  ptr = ::$proto_ns$::internal::InlineGreedyStringParser($msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n}\nconst std::string* str = &$msg$$name$_.Get(); (void)str;\n"
             ,&default_string);
  std::__cxx11::string::~string((string *)&default_string);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateArenaString(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (HasHasbit(field)) {
    format("_Internal::set_has_$1$(&$has_bits$);\n", FieldName(field));
  }
  std::string default_string =
      field->default_value_string().empty()
          ? "::" + ProtobufNamespace(options_) +
                "::internal::GetEmptyStringAlreadyInited()"
          : QualifiedClassName(field->containing_type(), options_) +
                "::" + MakeDefaultName(field) + ".get()";
  format(
      "if (arena != nullptr) {\n"
      "  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  if (IsStringInlined(field, options_)) {
    GOOGLE_DCHECK(!inlined_string_indices_.empty());
    int inlined_string_index = inlined_string_indices_[field->index()];
    GOOGLE_DCHECK_GE(inlined_string_index, 0);
    format(
        ", $msg$_internal_$name$_donated()"
        ", &$msg$_inlined_string_donated_[$1$]"
        ", ~0x$2$u",
        inlined_string_index / 32,
        strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8));
  } else {
    GOOGLE_DCHECK(field->default_value_string().empty());
  }
  format(
      ");\n"
      "} else {\n"
      "  ptr = ::$proto_ns$::internal::InlineGreedyStringParser("
      "$msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n"
      "}\n"
      "const std::string* str = &$msg$$name$_.Get(); (void)str;\n",
      default_string);
}